

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

SDL_Surface * GPU_LoadSurface_RW(SDL_RWops *rwops,_Bool free_rwops)

{
  int len;
  stbi_uc *buffer;
  stbi_uc *data_00;
  char *pcVar1;
  SDL_Surface *pSVar2;
  uchar *c_data;
  int data_bytes;
  SDL_Surface *result;
  uchar *data;
  int channels;
  int height;
  int width;
  _Bool free_rwops_local;
  SDL_RWops *rwops_local;
  
  height._3_1_ = free_rwops;
  _width = rwops;
  if (rwops == (SDL_RWops *)0x0) {
    GPU_PushErrorCode("GPU_LoadSurface_RW",GPU_ERROR_NULL_ARGUMENT,"rwops");
    rwops_local = (SDL_RWops *)0x0;
  }
  else {
    SDL_RWseek(rwops,0,0);
    len = SDL_RWseek(_width,0,2);
    SDL_RWseek(_width,0,0);
    buffer = (stbi_uc *)SDL_malloc((long)len);
    SDL_RWread(_width,buffer,1,(long)len);
    data_00 = stbi_load_from_memory(buffer,len,&channels,(int *)((long)&data + 4),(int *)&data,0);
    SDL_free(buffer);
    if ((height._3_1_ & 1) != 0) {
      SDL_RWclose(_width);
    }
    if (data_00 == (stbi_uc *)0x0) {
      pcVar1 = stbi_failure_reason();
      GPU_PushErrorCode("GPU_LoadSurface_RW",GPU_ERROR_DATA_ERROR,"Failed to load from rwops: %s",
                        pcVar1);
      rwops_local = (SDL_RWops *)0x0;
    }
    else {
      pSVar2 = gpu_copy_raw_surface_data(data_00,channels,data._4_4_,(int)data);
      stbi_image_free(data_00);
      rwops_local = (SDL_RWops *)pSVar2;
    }
  }
  return (SDL_Surface *)rwops_local;
}

Assistant:

SDL_Surface* GPU_LoadSurface_RW(SDL_RWops* rwops, GPU_bool free_rwops)
{
    int width, height, channels;
    unsigned char* data;
    SDL_Surface* result;
    
    int data_bytes;
    unsigned char* c_data;

    if(rwops == NULL)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_NULL_ARGUMENT, "rwops");
        return NULL;
    }

    // Get count of bytes
    SDL_RWseek(rwops, 0, SEEK_SET);
    data_bytes = (int)SDL_RWseek(rwops, 0, SEEK_END);
    SDL_RWseek(rwops, 0, SEEK_SET);
    
    // Read in the rwops data
    c_data = (unsigned char*)SDL_malloc(data_bytes);
    SDL_RWread(rwops, c_data, 1, data_bytes);
    
    // Load image
    data = stbi_load_from_memory(c_data, data_bytes, &width, &height, &channels, 0);
    
    // Clean up temp data
    SDL_free(c_data);
    if(free_rwops)
        SDL_RWclose(rwops);

    if(data == NULL)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_DATA_ERROR, "Failed to load from rwops: %s", stbi_failure_reason());
        return NULL;
    }

    // Copy into a surface
    result = gpu_copy_raw_surface_data(data, width, height, channels);

    stbi_image_free(data);

    return result;
}